

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Hop_Obj_t * Abc_ObjHopFromGia(Hop_Man_t *pHopMan,Gia_Man_t *p,int GiaId,Vec_Ptr_t *vCopies)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  Hop_Obj_t *pHVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  
  if (-1 < GiaId) {
    uVar4 = p->vMapping->nSize;
    if (GiaId < (int)uVar4) {
      piVar3 = p->vMapping->pArray;
      uVar1 = piVar3[(uint)GiaId];
      if ((ulong)uVar1 == 0) {
        __assert_fail("Gia_ObjIsLut(p, GiaId)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                      ,0x2b5,
                      "Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
      }
      if ((-1 < (int)uVar1) && (uVar1 < uVar4)) {
        if (piVar3[uVar1] < 1) {
          __assert_fail("Gia_ObjLutSize(p, GiaId) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x2b6,
                        "Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
        }
        Gia_ManIncrementTravId(p);
        pVVar6 = p->vMapping;
        uVar4 = pVVar6->nSize;
        if (GiaId < (int)uVar4) {
          lVar8 = 0;
          do {
            piVar3 = pVVar6->pArray;
            lVar7 = (long)piVar3[(uint)GiaId];
            if ((lVar7 < 0) || (uVar4 <= (uint)piVar3[(uint)GiaId])) break;
            if (piVar3[lVar7] <= lVar8) {
              pHVar5 = Abc_ObjHopFromGia_rec(pHopMan,p,GiaId,vCopies);
              return pHVar5;
            }
            iVar2 = piVar3[lVar7 + lVar8 + 1];
            if (p->nTravIdsAlloc <= iVar2) {
              __assert_fail("Id < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
            }
            p->pTravIds[iVar2] = p->nTravIds;
            pHVar5 = Hop_IthVar(pHopMan,(int)lVar8);
            if ((iVar2 < 0) || (vCopies->nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            vCopies->pArray[iVar2] = pHVar5;
            lVar8 = lVar8 + 1;
            pVVar6 = p->vMapping;
            uVar4 = pVVar6->nSize;
          } while (GiaId < (int)uVar4);
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Hop_Obj_t * Abc_ObjHopFromGia( Hop_Man_t * pHopMan, Gia_Man_t * p, int GiaId, Vec_Ptr_t * vCopies )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, GiaId) );
    assert( Gia_ObjLutSize(p, GiaId) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, GiaId, iFan, k )
    {
        Gia_ObjSetTravIdCurrentId(p, iFan);
        Vec_PtrWriteEntry( vCopies, iFan, Hop_IthVar(pHopMan, k) );
    }
    return Abc_ObjHopFromGia_rec( pHopMan, p, GiaId, vCopies );
}